

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O1

int __thiscall
vkt::shaderexecutor::ShaderCommonFunctionTests::init
          (ShaderCommonFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  ShaderSpec *this_00;
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *pvVar1;
  TestContext *pTVar2;
  int iVar3;
  int iVar4;
  DataType DVar5;
  TestNode *pTVar6;
  CommonFunctionCase *pCVar7;
  long lVar8;
  TestNode *pTVar9;
  uint uVar10;
  ulong uVar11;
  int shaderTypeNdx_2;
  DataType DVar12;
  int prec_9;
  ulong in_R8;
  int shaderTypeNdx_8;
  int shaderTypeNdx;
  Precision PVar13;
  ShaderType SVar14;
  int prec;
  Precision PVar15;
  string local_d8;
  TestNode *local_b8;
  Symbol local_b0;
  TestNode *local_78;
  TestNode *local_70;
  TestNode *local_68;
  ulong local_60;
  ulong local_58;
  VarType local_50;
  long local_38;
  
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"abs",
             "abs");
  local_b8 = pTVar6;
  local_68 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  lVar8 = 0;
  do {
    local_60 = lVar8;
    if (lVar8 != 2) {
      local_70 = (TestNode *)(ulong)(*(int *)(&DAT_00b8791c + lVar8 * 4) - 1);
      uVar11 = 1;
      do {
        DVar12 = (int)local_70 + (int)uVar11;
        PVar15 = PRECISION_MEDIUMP;
        local_78 = (TestNode *)uVar11;
        do {
          PVar13 = PRECISION_LOWP;
          do {
            SVar14 = (ShaderType)in_R8;
            pCVar7 = (CommonFunctionCase *)operator_new(0xf0);
            pTVar2 = local_68->m_testCtx;
            shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                      (&local_b0.name,(_anonymous_namespace_ *)(ulong)DVar12,PVar15,PVar13,SVar14);
            shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                      (pCVar7,pTVar2,local_b0.name._M_dataplus._M_p,"abs",PVar13);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            (pCVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__CommonFunctionCase_00d687a8;
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_local_buf[2] = '0';
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x6e69;
            local_d8._M_string_length = 3;
            local_d8.field_2._M_local_buf[3] = '\0';
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).inputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x756f;
            local_d8.field_2._M_local_buf[2] = 't';
            local_d8.field_2._M_local_buf[3] = '0';
            local_d8._M_string_length = 4;
            local_d8.field_2._M_allocated_capacity._4_4_ =
                 local_d8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).outputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            in_R8 = 0x10;
            std::__cxx11::string::_M_replace
                      ((ulong)&(pCVar7->m_spec).source,0,
                       (char *)(pCVar7->m_spec).source._M_string_length,0xb86f82);
            tcu::TestNode::addChild(local_b8,(TestNode *)pCVar7);
            PVar13 = PVar13 + PRECISION_MEDIUMP;
          } while (PVar13 != 6);
          PVar15 = PVar15 + PRECISION_MEDIUMP;
        } while (PVar15 != PRECISION_LAST);
        uVar10 = (int)local_78 + 1;
        uVar11 = (ulong)uVar10;
      } while (uVar10 != 5);
    }
    lVar8 = local_60 + 1;
  } while (lVar8 != 3);
  pTVar9 = (TestNode *)operator_new(0x70);
  pTVar6 = local_68;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar9,local_68->m_testCtx,"sign","sign");
  local_b8 = pTVar9;
  tcu::TestNode::addChild(pTVar6,pTVar9);
  lVar8 = 0;
  do {
    local_60 = lVar8;
    if (lVar8 != 2) {
      local_70 = (TestNode *)(ulong)(*(int *)(&DAT_00b8791c + lVar8 * 4) - 1);
      uVar11 = 1;
      do {
        DVar12 = (int)local_70 + (int)uVar11;
        PVar15 = PRECISION_MEDIUMP;
        local_78 = (TestNode *)uVar11;
        do {
          PVar13 = PRECISION_LOWP;
          do {
            SVar14 = (ShaderType)in_R8;
            pCVar7 = (CommonFunctionCase *)operator_new(0xf0);
            pTVar2 = local_68->m_testCtx;
            shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                      (&local_b0.name,(_anonymous_namespace_ *)(ulong)DVar12,PVar15,PVar13,SVar14);
            shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                      (pCVar7,pTVar2,local_b0.name._M_dataplus._M_p,"sign",PVar13);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            (pCVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__CommonFunctionCase_00d68858;
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_local_buf[2] = '0';
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x6e69;
            local_d8._M_string_length = 3;
            local_d8.field_2._M_local_buf[3] = '\0';
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).inputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x756f;
            local_d8.field_2._M_local_buf[2] = 't';
            local_d8.field_2._M_local_buf[3] = '0';
            local_d8._M_string_length = 4;
            local_d8.field_2._M_allocated_capacity._4_4_ =
                 local_d8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).outputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            in_R8 = 0x11;
            std::__cxx11::string::_M_replace
                      ((ulong)&(pCVar7->m_spec).source,0,
                       (char *)(pCVar7->m_spec).source._M_string_length,0xb86f93);
            tcu::TestNode::addChild(local_b8,(TestNode *)pCVar7);
            PVar13 = PVar13 + PRECISION_MEDIUMP;
          } while (PVar13 != 6);
          PVar15 = PVar15 + PRECISION_MEDIUMP;
        } while (PVar15 != PRECISION_LAST);
        uVar10 = (int)local_78 + 1;
        uVar11 = (ulong)uVar10;
      } while (uVar10 != 5);
    }
    lVar8 = local_60 + 1;
  } while (lVar8 != 3);
  pTVar9 = (TestNode *)operator_new(0x70);
  pTVar6 = local_68;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar9,local_68->m_testCtx,"floor","floor");
  local_b8 = pTVar9;
  tcu::TestNode::addChild(pTVar6,pTVar9);
  lVar8 = 0;
  do {
    local_60 = lVar8;
    if (1 < (int)lVar8 - 1U) {
      local_70 = (TestNode *)(ulong)(*(int *)(&DAT_00b8791c + lVar8 * 4) - 1);
      uVar11 = 1;
      do {
        DVar12 = (int)local_70 + (int)uVar11;
        PVar15 = PRECISION_MEDIUMP;
        local_78 = (TestNode *)uVar11;
        do {
          PVar13 = PRECISION_LOWP;
          do {
            SVar14 = (ShaderType)in_R8;
            pCVar7 = (CommonFunctionCase *)operator_new(0xf0);
            pTVar2 = local_68->m_testCtx;
            shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                      (&local_b0.name,(_anonymous_namespace_ *)(ulong)DVar12,PVar15,PVar13,SVar14);
            shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                      (pCVar7,pTVar2,local_b0.name._M_dataplus._M_p,"floor",PVar13);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            (pCVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__CommonFunctionCase_00d68908;
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_local_buf[2] = '0';
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x6e69;
            local_d8._M_string_length = 3;
            local_d8.field_2._M_local_buf[3] = '\0';
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).inputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x756f;
            local_d8.field_2._M_local_buf[2] = 't';
            local_d8.field_2._M_local_buf[3] = '0';
            local_d8._M_string_length = 4;
            local_d8.field_2._M_allocated_capacity._4_4_ =
                 local_d8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).outputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            in_R8 = 0x12;
            std::__cxx11::string::_M_replace
                      ((ulong)&(pCVar7->m_spec).source,0,
                       (char *)(pCVar7->m_spec).source._M_string_length,0xb86fa5);
            tcu::TestNode::addChild(local_b8,(TestNode *)pCVar7);
            PVar13 = PVar13 + PRECISION_MEDIUMP;
          } while (PVar13 != 6);
          PVar15 = PVar15 + PRECISION_MEDIUMP;
        } while (PVar15 != PRECISION_LAST);
        uVar10 = (int)local_78 + 1;
        uVar11 = (ulong)uVar10;
      } while (uVar10 != 5);
    }
    lVar8 = local_60 + 1;
  } while (lVar8 != 3);
  pTVar9 = (TestNode *)operator_new(0x70);
  pTVar6 = local_68;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar9,local_68->m_testCtx,"trunc","trunc");
  local_b8 = pTVar9;
  tcu::TestNode::addChild(pTVar6,pTVar9);
  lVar8 = 0;
  do {
    local_60 = lVar8;
    if (1 < (int)lVar8 - 1U) {
      local_70 = (TestNode *)(ulong)(*(int *)(&DAT_00b8791c + lVar8 * 4) - 1);
      uVar11 = 1;
      do {
        DVar12 = (int)local_70 + (int)uVar11;
        PVar15 = PRECISION_MEDIUMP;
        local_78 = (TestNode *)uVar11;
        do {
          PVar13 = PRECISION_LOWP;
          do {
            SVar14 = (ShaderType)in_R8;
            pCVar7 = (CommonFunctionCase *)operator_new(0xf0);
            pTVar2 = local_68->m_testCtx;
            shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                      (&local_b0.name,(_anonymous_namespace_ *)(ulong)DVar12,PVar15,PVar13,SVar14);
            shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                      (pCVar7,pTVar2,local_b0.name._M_dataplus._M_p,"trunc",PVar13);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            (pCVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__CommonFunctionCase_00d689b8;
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_local_buf[2] = '0';
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x6e69;
            local_d8._M_string_length = 3;
            local_d8.field_2._M_local_buf[3] = '\0';
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).inputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x756f;
            local_d8.field_2._M_local_buf[2] = 't';
            local_d8.field_2._M_local_buf[3] = '0';
            local_d8._M_string_length = 4;
            local_d8.field_2._M_allocated_capacity._4_4_ =
                 local_d8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).outputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            in_R8 = 0x12;
            std::__cxx11::string::_M_replace
                      ((ulong)&(pCVar7->m_spec).source,0,
                       (char *)(pCVar7->m_spec).source._M_string_length,0xb86fd4);
            tcu::TestNode::addChild(local_b8,(TestNode *)pCVar7);
            PVar13 = PVar13 + PRECISION_MEDIUMP;
          } while (PVar13 != 6);
          PVar15 = PVar15 + PRECISION_MEDIUMP;
        } while (PVar15 != PRECISION_LAST);
        uVar10 = (int)local_78 + 1;
        uVar11 = (ulong)uVar10;
      } while (uVar10 != 5);
    }
    lVar8 = local_60 + 1;
  } while (lVar8 != 3);
  pTVar9 = (TestNode *)operator_new(0x70);
  pTVar6 = local_68;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar9,local_68->m_testCtx,"round","round");
  local_b8 = pTVar9;
  tcu::TestNode::addChild(pTVar6,pTVar9);
  lVar8 = 0;
  do {
    local_60 = lVar8;
    if (1 < (int)lVar8 - 1U) {
      local_70 = (TestNode *)(ulong)(*(int *)(&DAT_00b8791c + lVar8 * 4) - 1);
      uVar11 = 1;
      do {
        DVar12 = (int)local_70 + (int)uVar11;
        PVar15 = PRECISION_MEDIUMP;
        local_78 = (TestNode *)uVar11;
        do {
          PVar13 = PRECISION_LOWP;
          do {
            SVar14 = (ShaderType)in_R8;
            pCVar7 = (CommonFunctionCase *)operator_new(0xf0);
            pTVar2 = local_68->m_testCtx;
            shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                      (&local_b0.name,(_anonymous_namespace_ *)(ulong)DVar12,PVar15,PVar13,SVar14);
            shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                      (pCVar7,pTVar2,local_b0.name._M_dataplus._M_p,"round",PVar13);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            (pCVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__CommonFunctionCase_00d68a68;
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_local_buf[2] = '0';
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x6e69;
            local_d8._M_string_length = 3;
            local_d8.field_2._M_local_buf[3] = '\0';
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).inputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x756f;
            local_d8.field_2._M_local_buf[2] = 't';
            local_d8.field_2._M_local_buf[3] = '0';
            local_d8._M_string_length = 4;
            local_d8.field_2._M_allocated_capacity._4_4_ =
                 local_d8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).outputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            in_R8 = 0x12;
            std::__cxx11::string::_M_replace
                      ((ulong)&(pCVar7->m_spec).source,0,
                       (char *)(pCVar7->m_spec).source._M_string_length,0xb86fe7);
            tcu::TestNode::addChild(local_b8,(TestNode *)pCVar7);
            PVar13 = PVar13 + PRECISION_MEDIUMP;
          } while (PVar13 != 6);
          PVar15 = PVar15 + PRECISION_MEDIUMP;
        } while (PVar15 != PRECISION_LAST);
        uVar10 = (int)local_78 + 1;
        uVar11 = (ulong)uVar10;
      } while (uVar10 != 5);
    }
    lVar8 = local_60 + 1;
  } while (lVar8 != 3);
  pTVar9 = (TestNode *)operator_new(0x70);
  pTVar6 = local_68;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,local_68->m_testCtx,"roundeven","roundeven");
  local_b8 = pTVar9;
  tcu::TestNode::addChild(pTVar6,pTVar9);
  lVar8 = 0;
  do {
    local_60 = lVar8;
    if (1 < (int)lVar8 - 1U) {
      local_70 = (TestNode *)(ulong)(*(int *)(&DAT_00b8791c + lVar8 * 4) - 1);
      uVar11 = 1;
      do {
        DVar12 = (int)local_70 + (int)uVar11;
        PVar15 = PRECISION_MEDIUMP;
        local_78 = (TestNode *)uVar11;
        do {
          PVar13 = PRECISION_LOWP;
          do {
            SVar14 = (ShaderType)in_R8;
            pCVar7 = (CommonFunctionCase *)operator_new(0xf0);
            pTVar2 = local_68->m_testCtx;
            shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                      (&local_b0.name,(_anonymous_namespace_ *)(ulong)DVar12,PVar15,PVar13,SVar14);
            shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                      (pCVar7,pTVar2,local_b0.name._M_dataplus._M_p,"roundEven",PVar13);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            (pCVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__CommonFunctionCase_00d68b18;
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_local_buf[2] = '0';
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x6e69;
            local_d8._M_string_length = 3;
            local_d8.field_2._M_local_buf[3] = '\0';
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).inputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x756f;
            local_d8.field_2._M_local_buf[2] = 't';
            local_d8.field_2._M_local_buf[3] = '0';
            local_d8._M_string_length = 4;
            local_d8.field_2._M_allocated_capacity._4_4_ =
                 local_d8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).outputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            in_R8 = 0x16;
            std::__cxx11::string::_M_replace
                      ((ulong)&(pCVar7->m_spec).source,0,
                       (char *)(pCVar7->m_spec).source._M_string_length,0xb86ffa);
            tcu::TestNode::addChild(local_b8,(TestNode *)pCVar7);
            PVar13 = PVar13 + PRECISION_MEDIUMP;
          } while (PVar13 != 6);
          PVar15 = PVar15 + PRECISION_MEDIUMP;
        } while (PVar15 != PRECISION_LAST);
        uVar10 = (int)local_78 + 1;
        uVar11 = (ulong)uVar10;
      } while (uVar10 != 5);
    }
    lVar8 = local_60 + 1;
  } while (lVar8 != 3);
  pTVar9 = (TestNode *)operator_new(0x70);
  pTVar6 = local_68;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar9,local_68->m_testCtx,"ceil","ceil");
  local_b8 = pTVar9;
  tcu::TestNode::addChild(pTVar6,pTVar9);
  lVar8 = 0;
  do {
    local_60 = lVar8;
    if (1 < (int)lVar8 - 1U) {
      local_70 = (TestNode *)(ulong)(*(int *)(&DAT_00b8791c + lVar8 * 4) - 1);
      uVar11 = 1;
      do {
        DVar12 = (int)local_70 + (int)uVar11;
        PVar15 = PRECISION_MEDIUMP;
        local_78 = (TestNode *)uVar11;
        do {
          PVar13 = PRECISION_LOWP;
          do {
            SVar14 = (ShaderType)in_R8;
            pCVar7 = (CommonFunctionCase *)operator_new(0xf0);
            pTVar2 = local_68->m_testCtx;
            shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                      (&local_b0.name,(_anonymous_namespace_ *)(ulong)DVar12,PVar15,PVar13,SVar14);
            shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                      (pCVar7,pTVar2,local_b0.name._M_dataplus._M_p,"ceil",PVar13);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            (pCVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__CommonFunctionCase_00d68bc8;
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_local_buf[2] = '0';
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x6e69;
            local_d8._M_string_length = 3;
            local_d8.field_2._M_local_buf[3] = '\0';
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).inputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x756f;
            local_d8.field_2._M_local_buf[2] = 't';
            local_d8.field_2._M_local_buf[3] = '0';
            local_d8._M_string_length = 4;
            local_d8.field_2._M_allocated_capacity._4_4_ =
                 local_d8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).outputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            in_R8 = 0x11;
            std::__cxx11::string::_M_replace
                      ((ulong)&(pCVar7->m_spec).source,0,
                       (char *)(pCVar7->m_spec).source._M_string_length,0xb87011);
            tcu::TestNode::addChild(local_b8,(TestNode *)pCVar7);
            PVar13 = PVar13 + PRECISION_MEDIUMP;
          } while (PVar13 != 6);
          PVar15 = PVar15 + PRECISION_MEDIUMP;
        } while (PVar15 != PRECISION_LAST);
        uVar10 = (int)local_78 + 1;
        uVar11 = (ulong)uVar10;
      } while (uVar10 != 5);
    }
    lVar8 = local_60 + 1;
  } while (lVar8 != 3);
  local_b8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_b8,local_68->m_testCtx,"fract","fract");
  tcu::TestNode::addChild(local_68,local_b8);
  uVar11 = 0;
  do {
    local_60 = uVar11;
    if (1 < (int)uVar11 - 1U) {
      local_70 = (TestNode *)(ulong)(*(int *)(&DAT_00b8791c + uVar11 * 4) - 1);
      uVar11 = 1;
      do {
        DVar12 = (int)local_70 + (int)uVar11;
        PVar15 = PRECISION_MEDIUMP;
        local_78 = (TestNode *)uVar11;
        do {
          PVar13 = PRECISION_LOWP;
          do {
            SVar14 = (ShaderType)in_R8;
            pCVar7 = (CommonFunctionCase *)operator_new(0xf0);
            pTVar2 = local_68->m_testCtx;
            shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                      (&local_b0.name,(_anonymous_namespace_ *)(ulong)DVar12,PVar15,PVar13,SVar14);
            shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                      (pCVar7,pTVar2,local_b0.name._M_dataplus._M_p,"fract",PVar13);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            (pCVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__CommonFunctionCase_00d68c78;
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_local_buf[2] = '0';
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x6e69;
            local_d8._M_string_length = 3;
            local_d8.field_2._M_local_buf[3] = '\0';
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).inputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x756f;
            local_d8.field_2._M_local_buf[2] = 't';
            local_d8.field_2._M_local_buf[3] = '0';
            local_d8._M_string_length = 4;
            local_d8.field_2._M_allocated_capacity._4_4_ =
                 local_d8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).outputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            in_R8 = 0x12;
            std::__cxx11::string::_M_replace
                      ((ulong)&(pCVar7->m_spec).source,0,
                       (char *)(pCVar7->m_spec).source._M_string_length,0xb87023);
            tcu::TestNode::addChild(local_b8,(TestNode *)pCVar7);
            PVar13 = PVar13 + PRECISION_MEDIUMP;
          } while (PVar13 != 6);
          PVar15 = PVar15 + PRECISION_MEDIUMP;
        } while (PVar15 != PRECISION_LAST);
        uVar10 = (int)local_78 + 1;
        uVar11 = (ulong)uVar10;
      } while (uVar10 != 5);
    }
    uVar11 = local_60 + 1;
  } while (uVar11 != 3);
  local_78 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_78,local_68->m_testCtx,"modf","modf");
  tcu::TestNode::addChild(local_68,local_78);
  local_58 = 0;
  do {
    if (1 < (int)local_58 - 1U) {
      local_60 = (ulong)(*(int *)(&DAT_00b8791c + local_58 * 4) - 1);
      uVar11 = 1;
      do {
        local_b8 = (TestNode *)CONCAT44(local_b8._4_4_,(int)local_60 + (int)uVar11);
        PVar15 = PRECISION_MEDIUMP;
        local_70 = (TestNode *)uVar11;
        do {
          PVar13 = PRECISION_LOWP;
          do {
            SVar14 = (ShaderType)in_R8;
            pCVar7 = (CommonFunctionCase *)operator_new(0xf0);
            pTVar2 = local_68->m_testCtx;
            shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                      (&local_b0.name,(_anonymous_namespace_ *)((ulong)local_b8 & 0xffffffff),PVar15
                       ,PVar13,SVar14);
            shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                      (pCVar7,pTVar2,local_b0.name._M_dataplus._M_p,"modf",PVar13);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            (pCVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__CommonFunctionCase_00d68d28;
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_local_buf[2] = '0';
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x6e69;
            local_d8._M_string_length = 3;
            local_d8.field_2._M_local_buf[3] = '\0';
            glu::VarType::VarType(&local_50,(Precision)local_b8,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).inputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x756f;
            local_d8.field_2._M_local_buf[2] = 't';
            local_d8.field_2._M_local_buf[3] = '0';
            local_d8._M_string_length = 4;
            local_d8.field_2._M_allocated_capacity._4_4_ =
                 local_d8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            glu::VarType::VarType(&local_50,(Precision)local_b8,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            pvVar1 = &(pCVar7->m_spec).outputs;
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(pvVar1,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x756f;
            local_d8.field_2._M_local_buf[2] = 't';
            local_d8.field_2._M_local_buf[3] = '1';
            local_d8._M_string_length = 4;
            local_d8.field_2._M_allocated_capacity._4_4_ =
                 local_d8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            glu::VarType::VarType(&local_50,(Precision)local_b8,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(pvVar1,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            in_R8 = 0x17;
            std::__cxx11::string::_M_replace
                      ((ulong)&(pCVar7->m_spec).source,0,
                       (char *)(pCVar7->m_spec).source._M_string_length,0xb8704a);
            tcu::TestNode::addChild(local_78,(TestNode *)pCVar7);
            PVar13 = PVar13 + PRECISION_MEDIUMP;
          } while (PVar13 != 6);
          PVar15 = PVar15 + PRECISION_MEDIUMP;
        } while (PVar15 != PRECISION_LAST);
        uVar10 = (int)local_70 + 1;
        uVar11 = (ulong)uVar10;
      } while (uVar10 != 5);
    }
    local_58 = local_58 + 1;
  } while (local_58 != 3);
  local_78 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_78,local_68->m_testCtx,"isnan","isnan");
  tcu::TestNode::addChild(local_68,local_78);
  local_58 = 0;
  do {
    if (1 < (int)local_58 - 1U) {
      local_60 = (ulong)(*(int *)(&DAT_00b8791c + local_58 * 4) - 1);
      local_70 = (TestNode *)0x1;
      do {
        DVar12 = (int)local_60 + (int)local_70;
        local_b8 = (TestNode *)CONCAT44(local_b8._4_4_,1);
        do {
          PVar15 = PRECISION_LOWP;
          do {
            SVar14 = (ShaderType)in_R8;
            pCVar7 = (CommonFunctionCase *)operator_new(0xf0);
            pTVar2 = local_68->m_testCtx;
            shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                      (&local_b0.name,(_anonymous_namespace_ *)(ulong)DVar12,(Precision)local_b8,
                       PVar15,SVar14);
            shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                      (pCVar7,pTVar2,local_b0.name._M_dataplus._M_p,"isnan",PVar15);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            (pCVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__CommonFunctionCase_00d68dd8;
            iVar4 = glu::getDataTypeScalarSize(DVar12);
            DVar5 = TYPE_BOOL;
            if (1 < iVar4) {
              DVar5 = glu::getDataTypeBoolVec(iVar4);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_local_buf[2] = '0';
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x6e69;
            local_d8._M_string_length = 3;
            local_d8.field_2._M_local_buf[3] = '\0';
            glu::VarType::VarType(&local_50,DVar12,(Precision)local_b8);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).inputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x756f;
            local_d8.field_2._M_local_buf[2] = 't';
            local_d8.field_2._M_local_buf[3] = '0';
            local_d8._M_string_length = 4;
            local_d8.field_2._M_allocated_capacity._4_4_ =
                 local_d8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            glu::VarType::VarType(&local_50,DVar5,PRECISION_LAST);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).outputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            in_R8 = 0x12;
            std::__cxx11::string::_M_replace
                      ((ulong)&(pCVar7->m_spec).source,0,
                       (char *)(pCVar7->m_spec).source._M_string_length,0xb8706e);
            tcu::TestNode::addChild(local_78,(TestNode *)pCVar7);
            PVar15 = PVar15 + PRECISION_MEDIUMP;
          } while (PVar15 != 6);
          iVar4 = (Precision)local_b8 + 1;
          local_b8 = (TestNode *)CONCAT44(local_b8._4_4_,iVar4);
        } while (iVar4 != 3);
        uVar10 = (int)local_70 + 1;
        local_70 = (TestNode *)(ulong)uVar10;
      } while (uVar10 != 5);
    }
    local_58 = local_58 + 1;
  } while (local_58 != 3);
  local_78 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_78,local_68->m_testCtx,"isinf","isinf");
  tcu::TestNode::addChild(local_68,local_78);
  local_58 = 0;
  do {
    if (1 < (int)local_58 - 1U) {
      local_60 = (ulong)(*(int *)(&DAT_00b8791c + local_58 * 4) - 1);
      local_70 = (TestNode *)0x1;
      do {
        DVar12 = (int)local_60 + (int)local_70;
        local_b8 = (TestNode *)CONCAT44(local_b8._4_4_,1);
        do {
          PVar15 = PRECISION_LOWP;
          do {
            SVar14 = (ShaderType)in_R8;
            pCVar7 = (CommonFunctionCase *)operator_new(0xf0);
            pTVar2 = local_68->m_testCtx;
            shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                      (&local_b0.name,(_anonymous_namespace_ *)(ulong)DVar12,(Precision)local_b8,
                       PVar15,SVar14);
            shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                      (pCVar7,pTVar2,local_b0.name._M_dataplus._M_p,"isinf",PVar15);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            (pCVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__CommonFunctionCase_00d68e88;
            iVar4 = glu::getDataTypeScalarSize(DVar12);
            DVar5 = TYPE_BOOL;
            if (1 < iVar4) {
              DVar5 = glu::getDataTypeBoolVec(iVar4);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_local_buf[2] = '0';
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x6e69;
            local_d8._M_string_length = 3;
            local_d8.field_2._M_local_buf[3] = '\0';
            glu::VarType::VarType(&local_50,DVar12,(Precision)local_b8);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).inputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x756f;
            local_d8.field_2._M_local_buf[2] = 't';
            local_d8.field_2._M_local_buf[3] = '0';
            local_d8._M_string_length = 4;
            local_d8.field_2._M_allocated_capacity._4_4_ =
                 local_d8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            glu::VarType::VarType(&local_50,DVar5,PRECISION_LAST);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).outputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            in_R8 = 0x12;
            std::__cxx11::string::_M_replace
                      ((ulong)&(pCVar7->m_spec).source,0,
                       (char *)(pCVar7->m_spec).source._M_string_length,0xb87081);
            tcu::TestNode::addChild(local_78,(TestNode *)pCVar7);
            PVar15 = PVar15 + PRECISION_MEDIUMP;
          } while (PVar15 != 6);
          iVar4 = (Precision)local_b8 + 1;
          local_b8 = (TestNode *)CONCAT44(local_b8._4_4_,iVar4);
        } while (iVar4 != 3);
        uVar10 = (int)local_70 + 1;
        local_70 = (TestNode *)(ulong)uVar10;
      } while (uVar10 != 5);
    }
    local_58 = local_58 + 1;
  } while (local_58 != 3);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,local_68->m_testCtx,"floatbitstoint","floatbitstoint");
  tcu::TestNode::addChild(local_68,pTVar6);
  local_70 = (TestNode *)0x0;
  do {
    if (1 < (int)local_70 - 1U) {
      local_78 = (TestNode *)(ulong)(*(int *)(&DAT_00b8791c + (long)local_70 * 4) - 1);
      local_b8 = (TestNode *)&DAT_00000001;
      do {
        iVar4 = (int)local_78;
        iVar3 = (int)local_b8;
        PVar15 = PRECISION_MEDIUMP;
        do {
          uVar11 = 0;
          do {
            in_R8 = uVar11;
            pTVar9 = (TestNode *)operator_new(0xf0);
            SVar14 = (ShaderType)in_R8;
            shaderexecutor::anon_unknown_0::FloatBitsToUintIntCase::FloatBitsToUintIntCase
                      ((FloatBitsToUintIntCase *)pTVar9,local_68->m_testCtx,iVar4 + iVar3,PVar15,
                       SVar14,true);
            pTVar9->_vptr_TestNode = (_func_int **)&PTR__CommonFunctionCase_00d68f38;
            tcu::TestNode::addChild(pTVar6,pTVar9);
            uVar10 = SVar14 + SHADERTYPE_FRAGMENT;
            uVar11 = (ulong)uVar10;
          } while (uVar10 != 6);
          PVar15 = PVar15 + PRECISION_MEDIUMP;
        } while (PVar15 != PRECISION_LAST);
        uVar10 = (int)local_b8 + 1;
        local_b8 = (TestNode *)(ulong)uVar10;
      } while (uVar10 != 5);
    }
    local_70 = (TestNode *)((long)local_70 + 1);
  } while (local_70 != (TestNode *)0x3);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,local_68->m_testCtx,"floatbitstouint","floatbitstouint");
  tcu::TestNode::addChild(local_68,pTVar6);
  local_70 = (TestNode *)0x0;
  do {
    if (1 < (int)local_70 - 1U) {
      local_78 = (TestNode *)(ulong)(*(int *)(&DAT_00b8791c + (long)local_70 * 4) - 1);
      local_b8 = (TestNode *)&DAT_00000001;
      do {
        iVar4 = (int)local_78;
        iVar3 = (int)local_b8;
        PVar15 = PRECISION_MEDIUMP;
        do {
          uVar11 = 0;
          do {
            in_R8 = uVar11;
            pTVar9 = (TestNode *)operator_new(0xf0);
            SVar14 = (ShaderType)in_R8;
            shaderexecutor::anon_unknown_0::FloatBitsToUintIntCase::FloatBitsToUintIntCase
                      ((FloatBitsToUintIntCase *)pTVar9,local_68->m_testCtx,iVar4 + iVar3,PVar15,
                       SVar14,false);
            pTVar9->_vptr_TestNode = (_func_int **)&PTR__CommonFunctionCase_00d69048;
            tcu::TestNode::addChild(pTVar6,pTVar9);
            uVar10 = SVar14 + SHADERTYPE_FRAGMENT;
            uVar11 = (ulong)uVar10;
          } while (uVar10 != 6);
          PVar15 = PVar15 + PRECISION_MEDIUMP;
        } while (PVar15 != PRECISION_LAST);
        uVar10 = (int)local_b8 + 1;
        local_b8 = (TestNode *)(ulong)uVar10;
      } while (uVar10 != 5);
    }
    local_70 = (TestNode *)((long)local_70 + 1);
  } while (local_70 != (TestNode *)0x3);
  local_78 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_78,local_68->m_testCtx,"frexp","frexp");
  tcu::TestNode::addChild(local_68,local_78);
  local_58 = 0;
  do {
    if (1 < (int)local_58 - 1U) {
      local_60 = (ulong)(*(int *)(&DAT_00b8791c + local_58 * 4) - 1);
      local_70 = (TestNode *)0x1;
      do {
        DVar12 = (int)local_60 + (int)local_70;
        local_b8 = (TestNode *)CONCAT44(local_b8._4_4_,1);
        do {
          PVar15 = PRECISION_LOWP;
          do {
            SVar14 = (ShaderType)in_R8;
            pCVar7 = (CommonFunctionCase *)operator_new(0xf0);
            pTVar2 = local_68->m_testCtx;
            shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                      (&local_b0.name,(_anonymous_namespace_ *)(ulong)DVar12,(Precision)local_b8,
                       PVar15,SVar14);
            shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                      (pCVar7,pTVar2,local_b0.name._M_dataplus._M_p,"frexp",PVar15);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            (pCVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__CommonFunctionCase_00d690a8;
            iVar4 = glu::getDataTypeScalarSize(DVar12);
            DVar5 = TYPE_INT;
            if (1 < iVar4) {
              DVar5 = glu::getDataTypeIntVec(iVar4);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_local_buf[2] = '0';
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x6e69;
            local_d8._M_string_length = 3;
            local_d8.field_2._M_local_buf[3] = '\0';
            glu::VarType::VarType(&local_50,DVar12,(Precision)local_b8);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).inputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x756f;
            local_d8.field_2._M_local_buf[2] = 't';
            local_d8.field_2._M_local_buf[3] = '0';
            local_d8._M_string_length = 4;
            local_d8.field_2._M_allocated_capacity._4_4_ =
                 local_d8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            glu::VarType::VarType(&local_50,DVar12,PRECISION_HIGHP);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            pvVar1 = &(pCVar7->m_spec).outputs;
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(pvVar1,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x756f;
            local_d8.field_2._M_local_buf[2] = 't';
            local_d8.field_2._M_local_buf[3] = '1';
            local_d8._M_string_length = 4;
            local_d8.field_2._M_allocated_capacity._4_4_ =
                 local_d8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            glu::VarType::VarType(&local_50,DVar5,PRECISION_HIGHP);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(pvVar1,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            in_R8 = 0x18;
            std::__cxx11::string::_M_replace
                      ((ulong)&(pCVar7->m_spec).source,0,
                       (char *)(pCVar7->m_spec).source._M_string_length,0xb870ec);
            tcu::TestNode::addChild(local_78,(TestNode *)pCVar7);
            PVar15 = PVar15 + PRECISION_MEDIUMP;
          } while (PVar15 != 6);
          iVar4 = (Precision)local_b8 + 1;
          local_b8 = (TestNode *)CONCAT44(local_b8._4_4_,iVar4);
        } while (iVar4 != 3);
        uVar10 = (int)local_70 + 1;
        local_70 = (TestNode *)(ulong)uVar10;
      } while (uVar10 != 5);
    }
    local_58 = local_58 + 1;
  } while (local_58 != 3);
  local_70 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_70,local_68->m_testCtx,"ldexp","ldexp");
  tcu::TestNode::addChild(local_68,local_70);
  local_38 = 0;
  do {
    if (1 < (int)local_38 - 1U) {
      local_58 = (ulong)(*(int *)(&DAT_00b8791c + local_38 * 4) - 1);
      local_60 = 1;
      do {
        local_b8 = (TestNode *)CONCAT44(local_b8._4_4_,(int)local_58 + (int)local_60);
        local_78 = (TestNode *)CONCAT44(local_78._4_4_,1);
        do {
          PVar15 = PRECISION_LOWP;
          do {
            SVar14 = (ShaderType)in_R8;
            pCVar7 = (CommonFunctionCase *)operator_new(0xf0);
            pTVar2 = local_68->m_testCtx;
            shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                      (&local_b0.name,(_anonymous_namespace_ *)((ulong)local_b8 & 0xffffffff),
                       (Precision)local_78,PVar15,SVar14);
            shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                      (pCVar7,pTVar2,local_b0.name._M_dataplus._M_p,"ldexp",PVar15);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            (pCVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__CommonFunctionCase_00d69158;
            iVar4 = glu::getDataTypeScalarSize((Precision)local_b8);
            DVar12 = TYPE_INT;
            if (1 < iVar4) {
              DVar12 = glu::getDataTypeIntVec(iVar4);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_local_buf[2] = '0';
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x6e69;
            local_d8._M_string_length = 3;
            local_d8.field_2._M_local_buf[3] = '\0';
            glu::VarType::VarType(&local_50,(Precision)local_b8,(Precision)local_78);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).inputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_local_buf[2] = '1';
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x6e69;
            local_d8._M_string_length = 3;
            local_d8.field_2._M_local_buf[3] = '\0';
            glu::VarType::VarType(&local_50,DVar12,PRECISION_HIGHP);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).inputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x756f;
            local_d8.field_2._M_local_buf[2] = 't';
            local_d8.field_2._M_local_buf[3] = '0';
            local_d8._M_string_length = 4;
            local_d8.field_2._M_allocated_capacity._4_4_ =
                 local_d8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            glu::VarType::VarType(&local_50,(Precision)local_b8,PRECISION_HIGHP);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).outputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            in_R8 = 0x17;
            std::__cxx11::string::_M_replace
                      ((ulong)&(pCVar7->m_spec).source,0,
                       (char *)(pCVar7->m_spec).source._M_string_length,0xb87105);
            tcu::TestNode::addChild(local_70,(TestNode *)pCVar7);
            PVar15 = PVar15 + PRECISION_MEDIUMP;
          } while (PVar15 != 6);
          iVar4 = (Precision)local_78 + 1;
          local_78 = (TestNode *)CONCAT44(local_78._4_4_,iVar4);
        } while (iVar4 != 3);
        uVar10 = (int)local_60 + 1;
        local_60 = (ulong)uVar10;
      } while (uVar10 != 5);
    }
    local_38 = local_38 + 1;
  } while (local_38 != 3);
  local_b8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_b8,local_68->m_testCtx,"fma","fma");
  tcu::TestNode::addChild(local_68,local_b8);
  local_60 = 0;
  do {
    if (1 < (int)local_60 - 1U) {
      local_70 = (TestNode *)(ulong)(*(int *)(&DAT_00b8791c + local_60 * 4) - 1);
      local_78 = (TestNode *)&DAT_00000001;
      do {
        DVar12 = (int)local_70 + (int)local_78;
        PVar15 = PRECISION_MEDIUMP;
        do {
          PVar13 = PRECISION_LOWP;
          do {
            SVar14 = (ShaderType)in_R8;
            pCVar7 = (CommonFunctionCase *)operator_new(0xf0);
            pTVar2 = local_68->m_testCtx;
            shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
                      (&local_b0.name,(_anonymous_namespace_ *)(ulong)DVar12,PVar15,PVar13,SVar14);
            shaderexecutor::anon_unknown_0::CommonFunctionCase::CommonFunctionCase
                      (pCVar7,pTVar2,local_b0.name._M_dataplus._M_p,"fma",PVar13);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            (pCVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__CommonFunctionCase_00d69208;
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x61;
            local_d8._M_string_length = 1;
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            this_00 = &pCVar7->m_spec;
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&this_00->inputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x62;
            local_d8._M_string_length = 1;
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&this_00->inputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_allocated_capacity._0_2_ = 99;
            local_d8._M_string_length = 1;
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&this_00->inputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8.field_2._M_local_buf[2] = 's';
            local_d8.field_2._M_allocated_capacity._0_2_ = 0x6572;
            local_d8._M_string_length = 3;
            local_d8.field_2._M_local_buf[3] = '\0';
            glu::VarType::VarType(&local_50,DVar12,PVar15);
            Symbol::Symbol(&local_b0,&local_d8,&local_50);
            std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
            emplace_back<vkt::shaderexecutor::Symbol>(&(pCVar7->m_spec).outputs,&local_b0);
            glu::VarType::~VarType(&local_b0.varType);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
              operator_delete(local_b0.name._M_dataplus._M_p,
                              local_b0.name.field_2._M_allocated_capacity + 1);
            }
            glu::VarType::~VarType(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_d8.field_2._M_local_buf[3],
                                                CONCAT12(local_d8.field_2._M_local_buf[2],
                                                         local_d8.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            std::__cxx11::string::_M_replace
                      ((ulong)&(pCVar7->m_spec).source,0,
                       (char *)(pCVar7->m_spec).source._M_string_length,0xb8713d);
            in_R8 = 0x28;
            std::__cxx11::string::_M_replace
                      ((ulong)&(pCVar7->m_spec).globalDeclarations,0,
                       (char *)(pCVar7->m_spec).globalDeclarations._M_string_length,0xb54bb1);
            tcu::TestNode::addChild(local_b8,(TestNode *)pCVar7);
            PVar13 = PVar13 + PRECISION_MEDIUMP;
          } while (PVar13 != 6);
          PVar15 = PVar15 + PRECISION_MEDIUMP;
        } while (PVar15 != PRECISION_LAST);
        uVar10 = (int)local_78 + 1;
        local_78 = (TestNode *)(ulong)uVar10;
      } while (uVar10 != 5);
    }
    local_60 = local_60 + 1;
  } while (local_60 != 3);
  local_b8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_b8,local_68->m_testCtx,"intbitstofloat","intBitsToFloat() Tests"
            );
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,local_68->m_testCtx,"uintbitstofloat","uintBitsToFloat() Tests"
            );
  pTVar6 = local_68;
  tcu::TestNode::addChild(local_68,local_b8);
  tcu::TestNode::addChild(pTVar6,pTVar9);
  local_78 = (TestNode *)CONCAT44(local_78._4_4_,1);
  do {
    DVar12 = TYPE_INT;
    if (1 < (Precision)local_78) {
      DVar12 = glu::getDataTypeIntVec((Precision)local_78);
    }
    DVar5 = TYPE_UINT;
    if (1 < (Precision)local_78) {
      DVar5 = glu::getDataTypeUintVec((Precision)local_78);
    }
    SVar14 = SHADERTYPE_VERTEX;
    do {
      if ((0x3cU >> (SVar14 & 0x1f) & 1) != 0) {
        pTVar6 = (TestNode *)operator_new(0xf0);
        shaderexecutor::anon_unknown_0::BitsToFloatCase::BitsToFloatCase
                  ((BitsToFloatCase *)pTVar6,local_68->m_testCtx,DVar12,SVar14);
        tcu::TestNode::addChild(local_b8,pTVar6);
        pTVar6 = (TestNode *)operator_new(0xf0);
        shaderexecutor::anon_unknown_0::BitsToFloatCase::BitsToFloatCase
                  ((BitsToFloatCase *)pTVar6,local_68->m_testCtx,DVar5,SVar14);
        tcu::TestNode::addChild(pTVar9,pTVar6);
      }
      SVar14 = SVar14 + SHADERTYPE_FRAGMENT;
    } while (SVar14 != SHADERTYPE_LAST);
    iVar4 = (Precision)local_78 + 1;
    local_78 = (TestNode *)CONCAT44(local_78._4_4_,iVar4);
  } while (iVar4 != 4);
  return 4;
}

Assistant:

void ShaderCommonFunctionTests::init (void)
{
	enum
	{
		VS = (1<<glu::SHADERTYPE_VERTEX),
		TC = (1<<glu::SHADERTYPE_TESSELLATION_CONTROL),
		TE = (1<<glu::SHADERTYPE_TESSELLATION_EVALUATION),
		GS = (1<<glu::SHADERTYPE_GEOMETRY),
		FS = (1<<glu::SHADERTYPE_FRAGMENT),
		CS = (1<<glu::SHADERTYPE_COMPUTE),

		ALL_SHADERS = VS|TC|TE|GS|FS|CS,
		NEW_SHADERS = TC|TE|GS|CS,
	};

	//																	Float?	Int?	Uint?	Shaders
	addFunctionCases<AbsCase>				(this,	"abs",				true,	true,	false,	ALL_SHADERS);
	addFunctionCases<SignCase>				(this,	"sign",				true,	true,	false,	ALL_SHADERS);
	addFunctionCases<FloorCase>				(this,	"floor",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<TruncCase>				(this,	"trunc",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<RoundCase>				(this,	"round",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<RoundEvenCase>			(this,	"roundeven",		true,	false,	false,	ALL_SHADERS);
	addFunctionCases<CeilCase>				(this,	"ceil",				true,	false,	false,	ALL_SHADERS);
	addFunctionCases<FractCase>				(this,	"fract",			true,	false,	false,	ALL_SHADERS);
	// mod
	addFunctionCases<ModfCase>				(this,	"modf",				true,	false,	false,	ALL_SHADERS);
	// min
	// max
	// clamp
	// mix
	// step
	// smoothstep
	addFunctionCases<IsnanCase>				(this,	"isnan",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<IsinfCase>				(this,	"isinf",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<FloatBitsToIntCase>	(this,	"floatbitstoint",	true,	false,	false,	ALL_SHADERS);
	addFunctionCases<FloatBitsToUintCase>	(this,	"floatbitstouint",	true,	false,	false,	ALL_SHADERS);

	addFunctionCases<FrexpCase>				(this,	"frexp",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<LdexpCase>				(this,	"ldexp",			true,	false,	false,	ALL_SHADERS);
	addFunctionCases<FmaCase>				(this,	"fma",				true,	false,	false,	ALL_SHADERS);

	// (u)intBitsToFloat()
	{
		const deUint32		shaderBits	= NEW_SHADERS;
		tcu::TestCaseGroup* intGroup	= new tcu::TestCaseGroup(m_testCtx, "intbitstofloat",	"intBitsToFloat() Tests");
		tcu::TestCaseGroup* uintGroup	= new tcu::TestCaseGroup(m_testCtx, "uintbitstofloat",	"uintBitsToFloat() Tests");

		addChild(intGroup);
		addChild(uintGroup);

		for (int vecSize = 1; vecSize < 4; vecSize++)
		{
			const glu::DataType		intType		= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::DataType		uintType	= vecSize > 1 ? glu::getDataTypeUintVec(vecSize) : glu::TYPE_UINT;

			for (int shaderType = 0; shaderType < glu::SHADERTYPE_LAST; shaderType++)
			{
				if (shaderBits & (1<<shaderType))
				{
					intGroup->addChild(new BitsToFloatCase(getTestContext(), intType, glu::ShaderType(shaderType)));
					uintGroup->addChild(new BitsToFloatCase(getTestContext(), uintType, glu::ShaderType(shaderType)));
				}
			}
		}
	}
}